

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

matd_t * matd_plu_p(matd_plu_t *mlu)

{
  uint uVar1;
  uint uVar2;
  matd_t *pmVar3;
  uint *puVar4;
  matd_t *pmVar5;
  ulong uVar6;
  ulong uVar7;
  
  pmVar3 = mlu->lu;
  uVar1 = pmVar3->nrows;
  pmVar5 = matd_create(uVar1,uVar1);
  uVar6 = (ulong)pmVar3->nrows;
  if (uVar6 != 0) {
    puVar4 = mlu->piv;
    uVar1 = pmVar5->ncols;
    uVar7 = 0;
    do {
      uVar2 = puVar4[uVar7];
      pmVar5[(ulong)(uVar2 * uVar1 + (int)uVar7) + 1].nrows = 0;
      pmVar5[(ulong)(uVar2 * uVar1 + (int)uVar7) + 1].ncols = 0x3ff00000;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return pmVar5;
}

Assistant:

matd_t *matd_plu_p(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;
    matd_t *P = matd_create(lu->nrows, lu->nrows);

    for (int i = 0; i < lu->nrows; i++) {
        MATD_EL(P, mlu->piv[i], i) = 1;
    }

    return P;
}